

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_upsync_module.c
# Opt level: O3

void ngx_http_upsync_begin_handler(ngx_event_t *event)

{
  void *pvVar1;
  size_t *psVar2;
  undefined8 *puVar3;
  long lVar4;
  long *plVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  in_addr_t iVar9;
  int iVar10;
  ngx_int_t nVar11;
  ngx_pool_t *pnVar12;
  ulong uVar13;
  u_char *puVar14;
  sockaddr *sa;
  size_t sVar15;
  size_t *psVar16;
  addrinfo *paVar17;
  addrinfo local_68;
  addrinfo *local_38;
  
  nVar11 = ngx_http_upsync_need_exit();
  if (nVar11 == 0) {
    pvVar1 = event->data;
    if (pvVar1 == (void *)0x0) {
      if (3 < ngx_cycle->log->log_level) {
        ngx_log_error_core(4,ngx_cycle->log,0,"ngx_http_upsync_begin_handler: upsync_server is null"
                          );
        return;
      }
    }
    else {
      if (*(ngx_pool_t **)((long)pvVar1 + 0x170) != (ngx_pool_t *)0x0) {
        ngx_destroy_pool(*(ngx_pool_t **)((long)pvVar1 + 0x170));
      }
      memset((void *)((long)pvVar1 + 0x170),0,0x170);
      if (parser != (http_parser *)0x0) {
        free(parser);
        parser = (http_parser *)0x0;
      }
      if ((*(byte *)((long)pvVar1 + 0x29) & 8) != 0) {
        if (((*(ngx_log_t **)((long)pvVar1 + 0x40))->log_level & 0x80) != 0) {
          ngx_log_error_core(8,*(ngx_log_t **)((long)pvVar1 + 0x40),0,"event timer del: %d: %M",
                             (ulong)*(uint *)(*(long *)((long)pvVar1 + 0x20) + 0x18),
                             *(undefined8 *)((long)pvVar1 + 0x48));
        }
        ngx_rbtree_delete(&ngx_event_timer_rbtree,(ngx_rbtree_node_t *)((long)pvVar1 + 0x48));
        *(undefined8 *)((long)pvVar1 + 0x50) = 0;
        *(undefined8 *)((long)pvVar1 + 0x58) = 0;
        *(undefined8 *)((long)pvVar1 + 0x60) = 0;
        *(byte *)((long)pvVar1 + 0x29) = *(byte *)((long)pvVar1 + 0x29) & 0xf7;
      }
      nVar11 = ngx_http_upsync_need_exit();
      if (nVar11 == 0) {
        local_38 = (addrinfo *)0x0;
        pvVar1 = event->data;
        psVar2 = *(size_t **)((long)pvVar1 + 0x2e0);
        if (*(long *)((long)pvVar1 + 0x170) == 0) {
          pnVar12 = ngx_create_pool(0x4000,ngx_cycle->log);
          if (pnVar12 == (ngx_pool_t *)0x0) {
            if (event->log->log_level < 4) {
              return;
            }
            ngx_log_error_core(4,event->log,0,
                               "upsync_init_consul: cannot create pool, not enough memory");
            return;
          }
          *(ngx_pool_t **)((long)pvVar1 + 0x170) = pnVar12;
        }
        *(undefined8 *)((long)pvVar1 + 0x130) = 0;
        *(undefined8 *)((long)pvVar1 + 0x138) = 0;
        *(undefined8 *)((long)pvVar1 + 0x160) = 0;
        *(undefined8 *)((long)pvVar1 + 0x168) = 0;
        *(undefined8 *)((long)pvVar1 + 0x150) = 0;
        *(undefined8 *)((long)pvVar1 + 0x158) = 0;
        *(undefined8 *)((long)pvVar1 + 0x140) = 0;
        *(undefined8 *)((long)pvVar1 + 0x148) = 0;
        *(undefined8 *)((long)pvVar1 + 0x120) = 0;
        *(undefined8 *)((long)pvVar1 + 0x128) = 0;
        *(undefined8 *)((long)pvVar1 + 0x110) = 0;
        *(undefined8 *)((long)pvVar1 + 0x118) = 0;
        *(undefined8 *)((long)pvVar1 + 0x100) = 0;
        *(undefined8 *)((long)pvVar1 + 0x108) = 0;
        *(code **)((long)pvVar1 + 0x130) = ngx_event_get_peer;
        *(ngx_log_t **)((long)pvVar1 + 0x160) = event->log;
        *(undefined1 *)((long)pvVar1 + 0x168) = 4;
        iVar9 = ngx_inet_addr((u_char *)psVar2[1],*psVar2);
        if (iVar9 == 0xffffffff) {
          puVar14 = (u_char *)ngx_pcalloc(*(ngx_pool_t **)((long)pvVar1 + 0x170),*psVar2 + 1);
          if (puVar14 == (u_char *)0x0) {
            return;
          }
          ngx_cpystrn(puVar14,(u_char *)psVar2[1],*psVar2 + 1);
          local_68.ai_addrlen = 0;
          local_68._20_4_ = 0;
          local_68.ai_addr = (sockaddr *)0x0;
          local_68.ai_canonname = (char *)0x0;
          local_68.ai_next = (addrinfo *)0x0;
          local_68.ai_socktype = 1;
          local_68.ai_protocol = 0;
          local_68.ai_flags = 0x20;
          local_68.ai_family = 0;
          iVar10 = getaddrinfo((char *)puVar14,(char *)0x0,&local_68,&local_38);
          paVar17 = local_38;
          if (iVar10 == 0) {
            for (; paVar17 != (addrinfo *)0x0; paVar17 = paVar17->ai_next) {
              if (paVar17->ai_family == 2) {
                sa = (sockaddr *)
                     ngx_pcalloc(*(ngx_pool_t **)((long)pvVar1 + 0x170),(ulong)paVar17->ai_addrlen);
                if (sa != (sockaddr *)0x0) {
                  memcpy(sa,paVar17->ai_addr,(ulong)paVar17->ai_addrlen);
                  *(ushort *)sa->sa_data = (ushort)psVar2[2] << 8 | (ushort)psVar2[2] >> 8;
                  *(sockaddr **)((long)pvVar1 + 0x108) = sa;
                  *(socklen_t *)((long)pvVar1 + 0x110) = paVar17->ai_addrlen;
                  puVar14 = (u_char *)ngx_pcalloc(*(ngx_pool_t **)((long)pvVar1 + 0x170),0x15);
                  if (puVar14 != (u_char *)0x0) {
                    sVar15 = ngx_sock_ntop(sa,paVar17->ai_addrlen,puVar14,0x15,1);
                    psVar16 = (size_t *)ngx_pcalloc(*(ngx_pool_t **)((long)pvVar1 + 0x170),0x10);
                    if (psVar16 != (size_t *)0x0) {
                      *psVar16 = sVar15;
                      psVar16[1] = (size_t)puVar14;
                      *(size_t **)((long)pvVar1 + 0x118) = psVar16;
                      goto LAB_00188446;
                    }
                  }
                }
                break;
              }
            }
          }
          else {
            local_38 = (addrinfo *)0x0;
          }
        }
        puVar3 = (undefined8 *)psVar2[0xf];
        *(undefined8 *)((long)pvVar1 + 0x108) = *puVar3;
        *(undefined4 *)((long)pvVar1 + 0x110) = *(undefined4 *)(puVar3 + 1);
        *(undefined8 **)((long)pvVar1 + 0x118) = puVar3 + 2;
        if (local_38 != (addrinfo *)0x0) {
LAB_00188446:
          freeaddrinfo(local_38);
        }
        pvVar1 = event->data;
        lVar4 = *(long *)(*(long *)((long)pvVar1 + 0x2e0) + 0x60);
        ngx_event_add_timer((ngx_event_t *)((long)pvVar1 + 0x80),
                            *(ngx_msec_t *)(*(long *)((long)pvVar1 + 0x2e0) + 0x18));
        uVar13 = ngx_event_connect_peer((ngx_peer_connection_t *)((long)pvVar1 + 0x100));
        if ((~uVar13 & 0xfffffffffffffffb) == 0) {
          if (3 < event->log->log_level) {
            ngx_log_error_core(4,event->log,0,
                               "upsync_connect_handler: cannot connect to upsync_server: %V ",
                               *(undefined8 *)((long)pvVar1 + 0x118));
          }
        }
        else {
          plVar5 = *(long **)((long)pvVar1 + 0x100);
          *plVar5 = (long)pvVar1;
          lVar6 = *(long *)((long)pvVar1 + 0x160);
          plVar5[10] = lVar6;
          *(byte *)((long)plVar5 + 0xda) = *(byte *)((long)plVar5 + 0xda) & 0xfb;
          lVar7 = plVar5[1];
          *(long *)(lVar7 + 0x20) = lVar6;
          lVar8 = plVar5[2];
          *(long *)(lVar8 + 0x20) = lVar6;
          *(byte *)((long)plVar5 + 0xd9) = *(byte *)((long)plVar5 + 0xd9) | 0x40;
          *(undefined8 *)(lVar8 + 0x10) = *(undefined8 *)(lVar4 + 0x18);
          *(undefined8 *)(lVar7 + 0x10) = *(undefined8 *)(lVar4 + 0x20);
          if (uVar13 == 0) {
            (**(code **)(lVar8 + 0x10))();
          }
        }
      }
    }
  }
  return;
}

Assistant:

static void
ngx_http_upsync_begin_handler(ngx_event_t *event)
{
    ngx_http_upsync_ctx_t          *ctx;
    ngx_http_upsync_server_t       *upsync_server;

    if (ngx_http_upsync_need_exit()) {
        return;
    }

    upsync_server = event->data;
    if (upsync_server == NULL) {
        ngx_log_error(NGX_LOG_ERR, ngx_cycle->log, 0,
                      "ngx_http_upsync_begin_handler: upsync_server is null");
        return;
    }

    ctx = &upsync_server->ctx;
    if (ctx->pool != NULL) {
        ngx_destroy_pool(ctx->pool);
    }
    ctx->pool = NULL;

    ngx_memzero(ctx, sizeof(*ctx));

    if (parser != NULL) {
        ngx_free(parser);
        parser = NULL;
    }

    if (upsync_server->upsync_ev.timer_set) {
        ngx_del_timer(&upsync_server->upsync_ev);
    }

    ngx_http_upsync_connect_handler(event);
}